

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O2

int mbedtls_asn1_get_sequence_of(uchar **p,uchar *end,mbedtls_asn1_sequence *cur,int tag)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  size_t in_RAX;
  mbedtls_asn1_sequence *pmVar4;
  byte *pbVar5;
  size_t len;
  
  len = in_RAX;
  iVar2 = mbedtls_asn1_get_tag(p,end,&len,0x30);
  if (iVar2 == 0) {
    pbVar5 = *p;
    if (pbVar5 + len == end) {
      iVar2 = -0x6a;
      while( true ) {
        do {
          if (end <= pbVar5) {
            cur->next = (mbedtls_asn1_sequence *)0x0;
            if (*p != end) {
              return -0x66;
            }
            return 0;
          }
          (cur->buf).tag = (uint)*pbVar5;
          iVar3 = mbedtls_asn1_get_tag(p,end,&(cur->buf).len,tag);
          if (iVar3 != 0) {
            return iVar3;
          }
          puVar1 = *p;
          (cur->buf).p = puVar1;
          pbVar5 = puVar1 + (cur->buf).len;
          *p = pbVar5;
        } while (end <= pbVar5);
        pmVar4 = (mbedtls_asn1_sequence *)calloc(1,0x20);
        cur->next = pmVar4;
        if (pmVar4 == (mbedtls_asn1_sequence *)0x0) break;
        pbVar5 = *p;
        cur = pmVar4;
      }
    }
    else {
      iVar2 = -0x66;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_asn1_get_sequence_of( unsigned char **p,
                          const unsigned char *end,
                          mbedtls_asn1_sequence *cur,
                          int tag)
{
    int ret;
    size_t len;
    mbedtls_asn1_buf *buf;

    /* Get main sequence tag */
    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( ret );

    if( *p + len != end )
        return( MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    while( *p < end )
    {
        buf = &(cur->buf);
        buf->tag = **p;

        if( ( ret = mbedtls_asn1_get_tag( p, end, &buf->len, tag ) ) != 0 )
            return( ret );

        buf->p = *p;
        *p += buf->len;

        /* Allocate and assign next pointer */
        if( *p < end )
        {
            cur->next = (mbedtls_asn1_sequence*)mbedtls_calloc( 1,
                                            sizeof( mbedtls_asn1_sequence ) );

            if( cur->next == NULL )
                return( MBEDTLS_ERR_ASN1_ALLOC_FAILED );

            cur = cur->next;
        }
    }

    /* Set final sequence entry's next pointer to NULL */
    cur->next = NULL;

    if( *p != end )
        return( MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}